

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionArgument.cpp
# Opt level: O0

void __thiscall
ninx::parser::element::FunctionArgument::FunctionArgument
          (FunctionArgument *this,string *name,
          unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
          *default_value)

{
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  *default_value_local;
  string *name_local;
  FunctionArgument *this_local;
  
  ASTElement::ASTElement(&this->super_ASTElement);
  (this->super_ASTElement)._vptr_ASTElement = (_func_int **)&PTR__FunctionArgument_001c7290;
  std::__cxx11::string::string((string *)&this->name,(string *)name);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::unique_ptr(&this->default_value,default_value);
  return;
}

Assistant:

ninx::parser::element::FunctionArgument::FunctionArgument(const std::string &name,
                                                          std::unique_ptr<ninx::parser::element::Expression> default_value)
        : name(name), default_value(std::move(default_value)) {}